

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void select_free(CManager_conflict cm,void *task_datav)

{
  code *pcVar1;
  FILE *__stream;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  timespec ts;
  
  pcVar1 = *task_datav;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,CMFreeVerbose);
    if (iVar2 == 0) goto LAB_00120e0a;
  }
  else if (CMtrace_val[7] == 0) goto LAB_00120e0a;
  if (CMtrace_PID != 0) {
    __stream = (FILE *)cm->CMTrace_file;
    _Var3 = getpid();
    pVar4 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar4);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,(timespec *)&ts);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"calling select FREE function, %p\n",
          *(undefined8 *)((long)task_datav + 8));
LAB_00120e0a:
  fflush((FILE *)cm->CMTrace_file);
  (*pcVar1)(&CMstatic_trans_svcs,cm,(long)task_datav + 8);
  CMdlclose(*(void **)((long)task_datav + 0x10));
  free(task_datav);
  return;
}

Assistant:

static void
 select_free(CManager cm, void *task_datav)
 {
     void **task_data = (void**)task_datav;
     SelectInitFunc select_free_function = (SelectInitFunc)task_data[0];
     CMtrace_out(cm, CMFreeVerbose, "calling select FREE function, %p\n", task_data[1]);
     select_free_function(&CMstatic_trans_svcs, cm, &task_data[1]);
#if !NO_DYNAMIC_LINKING
     CMdlclose(task_data[2]);
#endif
     free(task_data);
 }